

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_scan_tag_uri
              (yaml_parser_t *parser,int directive,yaml_char_t *head,yaml_mark_t start_mark,
              yaml_char_t **uri)

{
  char cVar1;
  size_t *psVar2;
  byte *pbVar3;
  byte bVar4;
  yaml_char_t *pyVar5;
  size_t sVar6;
  size_t sVar7;
  byte *pbVar8;
  size_t sVar9;
  long lVar10;
  char cVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  byte *pbVar16;
  ulong uVar17;
  byte bVar18;
  char *pcVar19;
  long lVar20;
  char *pcVar21;
  uint uVar22;
  long lVar23;
  byte *local_60;
  byte *local_58;
  byte *pbStack_50;
  int local_44;
  yaml_mark_t *local_40;
  yaml_char_t **local_38;
  
  if (head == (yaml_char_t *)0x0) {
    sVar15 = 0;
  }
  else {
    sVar15 = strlen((char *)head);
  }
  local_58 = (byte *)0x0;
  pbStack_50 = (byte *)0x0;
  local_60 = (byte *)yaml_malloc(0x10);
  if (local_60 != (byte *)0x0) {
    local_58 = local_60 + 0x10;
    local_60[0] = 0;
    local_60[1] = 0;
    local_60[2] = 0;
    local_60[3] = 0;
    local_60[4] = 0;
    local_60[5] = 0;
    local_60[6] = 0;
    local_60[7] = 0;
    local_60[8] = 0;
    local_60[9] = 0;
    local_60[10] = 0;
    local_60[0xb] = 0;
    local_60[0xc] = 0;
    local_60[0xd] = 0;
    local_60[0xe] = 0;
    local_60[0xf] = 0;
    pbStack_50 = local_60;
    local_44 = directive;
    local_38 = uri;
    do {
      if (sVar15 < (ulong)((long)local_58 - (long)local_60)) {
        if (1 < sVar15) {
          memcpy(local_60,head + 1,sVar15 - 1);
          pbStack_50 = pbStack_50 + (sVar15 - 1);
        }
        if ((parser->unread == 0) && (iVar13 = yaml_parser_update_buffer(parser,1), iVar13 == 0))
        goto LAB_00113117;
        local_40 = &parser->mark;
        lVar10 = 1;
        goto LAB_00113177;
      }
      iVar13 = yaml_string_extend(&local_60,&pbStack_50,&local_58);
    } while (iVar13 != 0);
  }
LAB_00113111:
  parser->error = YAML_MEMORY_ERROR;
  goto LAB_00113117;
LAB_00113177:
  do {
    pbVar16 = (parser->buffer).pointer;
    bVar18 = *pbVar16;
    if (((byte)(bVar18 - 0x30) < 10) || ((byte)((bVar18 & 0xdf) + 0xbf) < 0x1a)) {
LAB_001131b8:
      if (local_58 <= pbStack_50 + 5) {
        iVar13 = yaml_string_extend(&local_60,&pbStack_50,&local_58);
        if (iVar13 == 0) goto LAB_00113111;
        pbVar16 = (parser->buffer).pointer;
        bVar18 = *pbVar16;
      }
      if ((char)bVar18 < '\0') {
        if ((bVar18 & 0xe0) == 0xc0) {
LAB_00113265:
          (parser->buffer).pointer = pbVar16 + 1;
          *pbStack_50 = *pbVar16;
          pbVar16 = (parser->buffer).pointer;
          pbStack_50 = pbStack_50 + 1;
          goto LAB_00113289;
        }
        if ((bVar18 & 0xf0) == 0xe0) {
LAB_00113241:
          (parser->buffer).pointer = pbVar16 + 1;
          *pbStack_50 = *pbVar16;
          pbVar16 = (parser->buffer).pointer;
          pbStack_50 = pbStack_50 + 1;
          goto LAB_00113265;
        }
        if ((bVar18 & 0xf8) == 0xf0) {
          (parser->buffer).pointer = pbVar16 + 1;
          *pbStack_50 = *pbVar16;
          pbVar16 = (parser->buffer).pointer;
          pbStack_50 = pbStack_50 + 1;
          goto LAB_00113241;
        }
      }
      else {
LAB_00113289:
        (parser->buffer).pointer = pbVar16 + 1;
        *pbStack_50 = *pbVar16;
        pbStack_50 = pbStack_50 + 1;
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar2 = &(parser->mark).column;
      *psVar2 = *psVar2 + 1;
      uVar17 = parser->unread - 1;
      parser->unread = uVar17;
    }
    else {
      uVar22 = bVar18 - 0x21;
      if (0x3e < uVar22) {
LAB_001135cb:
        if (bVar18 == 0x7e) goto LAB_001131b8;
        if (sVar15 != 0) {
          *local_38 = local_60;
          return 1;
        }
        if ((local_58 <= pbStack_50 + 5) &&
           (iVar13 = yaml_string_extend(&local_60,&pbStack_50,&local_58), iVar13 == 0))
        goto LAB_00113111;
        pcVar21 = "while parsing a %TAG directive";
        if (local_44 == 0) {
          pcVar21 = "while parsing a tag";
        }
        parser->error = YAML_SCANNER_ERROR;
        parser->context = pcVar21;
        (parser->context_mark).index = start_mark.index;
        (parser->context_mark).line = start_mark.line;
        (parser->context_mark).column = start_mark.column;
        parser->problem = "did not find expected tag URI";
LAB_00113637:
        sVar6 = local_40->line;
        (parser->problem_mark).index = local_40->index;
        (parser->problem_mark).line = sVar6;
        (parser->problem_mark).column = local_40->column;
        break;
      }
      if ((0x54000000d6007fe9U >> ((ulong)uVar22 & 0x3f) & 1) != 0) goto LAB_001131b8;
      if ((ulong)uVar22 != 4) goto LAB_001135cb;
      if ((local_58 <= pbStack_50 + 5) &&
         (iVar13 = yaml_string_extend(&local_60,&pbStack_50,&local_58), iVar13 == 0))
      goto LAB_00113111;
      uVar17 = parser->unread;
      iVar13 = 0;
      do {
        if ((uVar17 < 3) && (iVar14 = yaml_parser_update_buffer(parser,3), iVar14 == 0))
        goto LAB_00113117;
        pyVar5 = (parser->buffer).pointer;
        if ((*pyVar5 != '%') ||
           ((bVar18 = pyVar5[1], 9 < (byte)(bVar18 - 0x30) &&
            ((0x25 < bVar18 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar18 - 0x41) & 0x3f) & 1) == 0))
            )))) {
LAB_001135ee:
          pcVar21 = "did not find URI escaped octet";
LAB_001135fe:
          pcVar19 = "while parsing a %TAG directive";
          if (local_44 == 0) {
            pcVar19 = "while parsing a tag";
          }
          parser->error = YAML_SCANNER_ERROR;
          parser->context = pcVar19;
          (parser->context_mark).index = start_mark.index;
          (parser->context_mark).line = start_mark.line;
          (parser->context_mark).column = start_mark.column;
          parser->problem = pcVar21;
          goto LAB_00113637;
        }
        bVar4 = pyVar5[2];
        if ((9 < (byte)(bVar4 - 0x30)) &&
           ((0x25 < bVar4 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar4 - 0x41) & 0x3f) & 1) == 0))))
        goto LAB_001135ee;
        cVar1 = bVar18 * '\x10' + -0x70;
        cVar11 = bVar18 * '\x10';
        if ((byte)(bVar18 + 0xbf) < 6) {
          cVar11 = cVar1;
        }
        if (0x60 < bVar18) {
          cVar11 = cVar1;
        }
        bVar18 = bVar4 + 0xa9;
        if (bVar4 < 0x61) {
          bVar18 = bVar4 - 0x30;
        }
        bVar12 = bVar4 - 0x37;
        if (5 < (byte)(bVar4 + 0xbf)) {
          bVar12 = bVar18;
        }
        bVar12 = bVar12 + cVar11;
        if (iVar13 != 0) {
          pcVar21 = "found an incorrect trailing UTF-8 octet";
          goto LAB_001135fe;
        }
        iVar13 = 1;
        if (((((char)bVar12 < '\0') && (iVar13 = 2, (bVar12 & 0xe0) != 0xc0)) &&
            (iVar13 = 3, (bVar12 & 0xf0) != 0xe0)) && (iVar13 = 4, (bVar12 & 0xf8) != 0xf0)) {
          pcVar21 = "found an incorrect leading UTF-8 octet";
          goto LAB_001135fe;
        }
        pbVar16 = pbStack_50 + 1;
        *pbStack_50 = bVar12;
        sVar6 = (parser->mark).index;
        (parser->mark).index = sVar6 + 1;
        sVar7 = (parser->mark).column;
        (parser->mark).column = sVar7 + 1;
        pbVar8 = (parser->buffer).pointer;
        sVar9 = parser->unread;
        parser->unread = sVar9 - 1;
        bVar18 = *pbVar8;
        lVar23 = lVar10;
        if ((((char)bVar18 < '\0') && (lVar23 = 2, (bVar18 & 0xe0) != 0xc0)) &&
           (lVar23 = 3, (bVar18 & 0xf0) != 0xe0)) {
          lVar23 = (ulong)((bVar18 & 0xf8) == 0xf0) << 2;
        }
        pbVar3 = pbVar8 + lVar23;
        (parser->buffer).pointer = pbVar3;
        (parser->mark).index = sVar6 + 2;
        (parser->mark).column = sVar7 + 2;
        parser->unread = sVar9 - 2;
        bVar18 = pbVar8[lVar23];
        lVar23 = lVar10;
        if ((((char)bVar18 < '\0') && (lVar23 = 2, (bVar18 & 0xe0) != 0xc0)) &&
           (lVar23 = 3, (bVar18 & 0xf0) != 0xe0)) {
          lVar23 = (ulong)((bVar18 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar3 + lVar23;
        (parser->mark).index = sVar6 + 3;
        (parser->mark).column = sVar7 + 3;
        uVar17 = sVar9 - 3;
        parser->unread = uVar17;
        bVar18 = pbVar3[lVar23];
        lVar20 = lVar10;
        if ((((char)bVar18 < '\0') && (lVar20 = 2, (bVar18 & 0xe0) != 0xc0)) &&
           (lVar20 = 3, (bVar18 & 0xf0) != 0xe0)) {
          lVar20 = (ulong)((bVar18 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar3 + lVar23 + lVar20;
        iVar13 = iVar13 + -1;
        pbStack_50 = pbVar16;
      } while (iVar13 != 0);
    }
    sVar15 = sVar15 + 1;
  } while ((uVar17 != 0) || (iVar13 = yaml_parser_update_buffer(parser,1), iVar13 != 0));
LAB_00113117:
  yaml_free(local_60);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag_uri(yaml_parser_t *parser, int directive,
        yaml_char_t *head, yaml_mark_t start_mark, yaml_char_t **uri)
{
    size_t length = head ? strlen((char *)head) : 0;
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Resize the string to include the head. */

    while ((size_t)(string.end - string.start) <= length) {
        if (!yaml_string_extend(&string.start, &string.pointer, &string.end)) {
            parser->error = YAML_MEMORY_ERROR;
            goto error;
        }
    }

    /*
     * Copy the head if needed.
     *
     * Note that we don't copy the leading '!' character.
     */

    if (length > 1) {
        memcpy(string.start, head+1, length-1);
        string.pointer += length-1;
    }

    /* Scan the tag. */

    if (!CACHE(parser, 1)) goto error;

    /*
     * The set of characters that may appear in URI is as follows:
     *
     *      '0'-'9', 'A'-'Z', 'a'-'z', '_', '-', ';', '/', '?', ':', '@', '&',
     *      '=', '+', '$', ',', '.', '!', '~', '*', '\'', '(', ')', '[', ']',
     *      '%'.
     */

    while (IS_ALPHA(parser->buffer) || CHECK(parser->buffer, ';')
            || CHECK(parser->buffer, '/') || CHECK(parser->buffer, '?')
            || CHECK(parser->buffer, ':') || CHECK(parser->buffer, '@')
            || CHECK(parser->buffer, '&') || CHECK(parser->buffer, '=')
            || CHECK(parser->buffer, '+') || CHECK(parser->buffer, '$')
            || CHECK(parser->buffer, ',') || CHECK(parser->buffer, '.')
            || CHECK(parser->buffer, '!') || CHECK(parser->buffer, '~')
            || CHECK(parser->buffer, '*') || CHECK(parser->buffer, '\'')
            || CHECK(parser->buffer, '(') || CHECK(parser->buffer, ')')
            || CHECK(parser->buffer, '[') || CHECK(parser->buffer, ']')
            || CHECK(parser->buffer, '%'))
    {
        /* Check if it is a URI-escape sequence. */

        if (CHECK(parser->buffer, '%')) {
            if (!STRING_EXTEND(parser, string))
                goto error;

            if (!yaml_parser_scan_uri_escapes(parser,
                        directive, start_mark, &string)) goto error;
        }
        else {
            if (!READ(parser, string)) goto error;
        }

        length ++;
        if (!CACHE(parser, 1)) goto error;
    }

    /* Check if the tag is non-empty. */

    if (!length) {
        if (!STRING_EXTEND(parser, string))
            goto error;

        yaml_parser_set_scanner_error(parser, directive ?
                "while parsing a %TAG directive" : "while parsing a tag",
                start_mark, "did not find expected tag URI");
        goto error;
    }

    *uri = string.start;

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}